

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupportTest_setDataFunctionPointer_Test::testBody
          (TEST_MockSupportTest_setDataFunctionPointer_Test *this)

{
  MockSupport *pMVar1;
  UtestShell *pUVar2;
  _func_void *p_Var3;
  TestTerminator *pTVar4;
  SimpleString local_80;
  SimpleString local_70;
  MockNamedValue local_60;
  
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar1 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"data");
  MockSupport::setData(pMVar1,&local_80,(_func_void *)0x1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar1 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"data");
  MockSupport::getData(&local_60,pMVar1,&local_70);
  p_Var3 = MockNamedValue::getFunctionPointerValue(&local_60);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x14])
            (pUVar2,1,p_Var3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x80,pTVar4);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockSupportTest, setDataFunctionPointer)
{
    void (*ptr)() = (void(*)()) 0x001;
    mock().setData("data", ptr);
    FUNCTIONPOINTERS_EQUAL(ptr, mock().getData("data").getFunctionPointerValue());
}